

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

void __thiscall
vkt::api::anon_unknown_1::PipelineLayout::Resources::Resources
          (Resources *this,Environment *env,Parameters *params)

{
  deInt32 *pdVar1;
  pointer *ppSVar2;
  SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>
  *__last;
  SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>
  *__first;
  Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout> *this_00;
  SharedPtrStateBase *pSVar3;
  ulong uVar4;
  SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>
  *__result;
  SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>
  *pSVar5;
  allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>_>
  *__alloc;
  allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>_>
  *extraout_RDX;
  size_t __n;
  ulong uVar6;
  ulong uVar7;
  pointer params_00;
  SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>
  local_40;
  
  (this->pSetLayouts).
  super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pSetLayouts).
  super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->descriptorSetLayouts).
  super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pSetLayouts).
  super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->descriptorSetLayouts).
  super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->descriptorSetLayouts).
  super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  params_00 = (params->descriptorSetLayouts).
              super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
              ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (params_00 ==
        (params->descriptorSetLayouts).
        super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    this_00 = (Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout> *)operator_new(0x60)
    ;
    Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>::Dependency
              (this_00,env,params_00);
    local_40.m_ptr = this_00;
    pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar3->strongRefCount = 0;
    pSVar3->weakRefCount = 0;
    pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00bf6a38;
    pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)this_00;
    pSVar3->strongRefCount = 1;
    pSVar3->weakRefCount = 1;
    __last = (this->descriptorSetLayouts).
             super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_40.m_state = pSVar3;
    if (__last == (this->descriptorSetLayouts).
                  super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      __first = (this->descriptorSetLayouts).
                super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((long)__last - (long)__first == 0x7ffffffffffffff0) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar7 = (long)__last - (long)__first >> 4;
      uVar4 = uVar7;
      if (__last == __first) {
        uVar4 = 1;
      }
      uVar6 = uVar4 + uVar7;
      __alloc = (allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>_>
                 *)0x7ffffffffffffff;
      if (0x7fffffffffffffe < uVar6) {
        uVar6 = 0x7ffffffffffffff;
      }
      if (CARRY8(uVar4,uVar7)) {
        uVar6 = 0x7ffffffffffffff;
      }
      if (uVar6 == 0) {
        __result = (SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>
                    *)0x0;
      }
      else {
        __result = (SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>
                    *)operator_new(uVar6 << 4);
      }
      __result[uVar7].m_ptr = this_00;
      __result[uVar7].m_state = pSVar3;
      LOCK();
      pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &(__result[uVar7].m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
      pSVar5 = std::
               __uninitialized_move_if_noexcept_a<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>>*,de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>>*,std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>>>>
                         (__first,__last,__result,__alloc);
      pSVar5 = std::
               __uninitialized_move_if_noexcept_a<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>>*,de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>>*,std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>>>>
                         (__last,__last,pSVar5 + 1,__alloc);
      std::
      _Destroy<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>>*,de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>>>
                (__first,__last,extraout_RDX);
      std::
      _Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>_>_>
      ::_M_deallocate((_Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>_>_>
                       *)__first,
                      (pointer)((long)(this->descriptorSetLayouts).
                                      super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)__first >> 4),__n);
      (this->descriptorSetLayouts).
      super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = __result;
      (this->descriptorSetLayouts).
      super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pSVar5;
      (this->descriptorSetLayouts).
      super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + uVar6;
    }
    else {
      __last->m_ptr = this_00;
      __last->m_state = pSVar3;
      LOCK();
      pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &__last->m_state->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
      ppSVar2 = &(this->descriptorSetLayouts).
                 super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppSVar2 = *ppSVar2 + 1;
    }
    de::
    SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>
    ::~SharedPtr(&local_40);
    std::vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>::
    push_back(&this->pSetLayouts,
              (value_type *)
              &((this->descriptorSetLayouts).
                super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr)->object);
    params_00 = params_00 + 1;
  } while( true );
}

Assistant:

Resources (const Environment& env, const Parameters& params)
		{
			for (vector<DescriptorSetLayout::Parameters>::const_iterator dsParams = params.descriptorSetLayouts.begin();
				 dsParams != params.descriptorSetLayouts.end();
				 ++dsParams)
			{
				descriptorSetLayouts.push_back(DescriptorSetLayoutDepSp(new Dependency<DescriptorSetLayout>(env, *dsParams)));
				pSetLayouts.push_back(*descriptorSetLayouts.back()->object);
			}
		}